

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

bool __thiscall flexbuffers::Reference::MutateInt(Reference *this,int64_t i)

{
  byte bVar1;
  BitWidth BVar2;
  uint8_t *__dest;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int64_t local_28;
  
  bVar4 = false;
  switch(this->type_) {
  case FBT_INT:
    __dest = this->data_;
    bVar1 = this->parent_width_;
    break;
  case FBT_UINT:
    bVar1 = this->parent_width_;
    if ((ulong)i < 0x100) {
      bVar3 = 0;
    }
    else if ((ulong)i < 0x10000) {
      bVar3 = 1;
    }
    else {
      bVar3 = 3 - ((ulong)i >> 0x20 == 0);
    }
    bVar5 = bVar1 >> (bVar3 & 0x3f) == 0;
    bVar4 = !bVar5;
    if (bVar5) {
      return bVar4;
    }
    __dest = this->data_;
    goto LAB_00149251;
  default:
    goto switchD_00149169_caseD_3;
  case FBT_INDIRECT_INT:
    __dest = Indirect(this);
    bVar1 = this->byte_width_;
    break;
  case FBT_INDIRECT_UINT:
    __dest = Indirect(this);
    bVar1 = this->byte_width_;
    if ((ulong)i < 0x100) {
      bVar3 = 0;
    }
    else if ((ulong)i < 0x10000) {
      bVar3 = 1;
    }
    else {
      bVar3 = 3 - ((ulong)i >> 0x20 == 0);
    }
    bVar3 = bVar1 >> (bVar3 & 0x3f);
    goto joined_r0x00149246;
  }
  BVar2 = WidthI(i);
  bVar3 = bVar1 >> ((byte)BVar2 & 0x3f);
joined_r0x00149246:
  bVar4 = bVar3 != 0;
  if (bVar4) {
LAB_00149251:
    local_28 = i;
    memcpy(__dest,&local_28,(ulong)bVar1);
  }
switchD_00149169_caseD_3:
  return bVar4;
}

Assistant:

bool MutateInt(int64_t i) {
    if (type_ == FBT_INT) {
      return Mutate(data_, i, parent_width_, WidthI(i));
    } else if (type_ == FBT_INDIRECT_INT) {
      return Mutate(Indirect(), i, byte_width_, WidthI(i));
    } else if (type_ == FBT_UINT) {
      auto u = static_cast<uint64_t>(i);
      return Mutate(data_, u, parent_width_, WidthU(u));
    } else if (type_ == FBT_INDIRECT_UINT) {
      auto u = static_cast<uint64_t>(i);
      return Mutate(Indirect(), u, byte_width_, WidthU(u));
    } else {
      return false;
    }
  }